

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[68],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [68],
               DebugComparison<int,_unsigned_long> *params_1,int *params_2,unsigned_long *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  int *params_00;
  unsigned_long *params_01;
  long lVar4;
  String argValues [4];
  size_t in_stack_ffffffffffffff50;
  String local_98 [2];
  String local_68;
  String local_50;
  
  str<char_const(&)[68]>
            (local_98,(kj *)params,(char (*) [68])CONCAT44(in_register_00000014,severity));
  _::operator*(&stack0xffffffffffffff50,params_1);
  str<int&>(&local_68,(kj *)params_2,params_00);
  str<unsigned_long&>(&local_50,(kj *)params_3,params_01);
  argValues_00.size_ = in_stack_ffffffffffffff50;
  argValues_00.ptr = (String *)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)local_98,argValues_00);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98[0].content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98[0].content.size_ + lVar4);
      *(undefined8 *)((long)&local_98[0].content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98[0].content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98[0].content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}